

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

Violation __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>::
ComputeViolation<std::vector<double,std::allocator<double>>>
          (AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>> *this,
          vector<double,_std::allocator<double>_> *x,bool logical)

{
  double dVar1;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  longdouble in_ST0;
  double dVar2;
  double dVar3;
  Violation VVar4;
  
  QuadAndLinTerms::ComputeValue<std::vector<double,std::allocator<double>>>
            ((longdouble *)(this + 0x20),(QuadAndLinTerms *)x,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,logical)));
  dVar1 = (double)in_ST0;
  dVar3 = *(double *)(this + 0x1d8);
  if (CONCAT31(in_register_00000011,logical) == 0) {
    if (dVar3 <= dVar1) {
      if (dVar1 <= dVar3) {
        dVar2 = dVar1 - dVar3;
        if (dVar1 - dVar3 <= dVar3 - dVar1) {
          dVar2 = dVar3 - dVar1;
        }
        dVar3 = 0.0;
      }
      else {
        dVar2 = dVar1 - dVar3;
      }
    }
    else {
      dVar2 = dVar3 - dVar1;
    }
  }
  else {
    dVar2 = (double)(-(ulong)(dVar3 != dVar1) & 0x3ff0000000000000);
    dVar3 = 1.0;
  }
  VVar4.valX_ = dVar3;
  VVar4.viol_ = dVar2;
  return VVar4;
}

Assistant:

Violation
  ComputeViolation(const VarInfo& x, bool logical=false) const {
    double bd = Body::ComputeValue(x);
    if (!logical) {
      if (RhsOrRange::lb() > bd)
        return {RhsOrRange::lb() - bd, RhsOrRange::lb()};
      if (bd > RhsOrRange::ub())
        return {bd - RhsOrRange::ub(), RhsOrRange::ub()};
      return
      {std::max( // negative. Same for strict cmp?
                 RhsOrRange::lb() - bd, bd - RhsOrRange::ub()),
            0.0};
    }
    return {double(!RhsOrRange::is_valid(bd)), 1.0};
  }